

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::AuxiliaryContext
          (ByteCodeWriter *this,OpCode op,RegSlot destinationRegister,void *buffer,int byteCount,
          RegSlot C1)

{
  RegSlot RVar1;
  int32 local_38;
  RegSlot local_34;
  OpLayoutAuxiliary data;
  int currentOffset;
  RegSlot C1_local;
  int byteCount_local;
  void *buffer_local;
  RegSlot destinationRegister_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  data.R0 = C1;
  CheckOpen(this);
  RVar1 = ConsumeReg(this,destinationRegister);
  data.R0 = ConsumeReg(this,data.R0);
  data.super_OpLayoutAuxNoReg.C1 = Data::GetCurrentOffset(&this->m_auxContextData);
  if (0 < byteCount) {
    Data::Encode(&this->m_auxContextData,buffer,byteCount);
  }
  local_38 = data.super_OpLayoutAuxNoReg.C1;
  local_34 = data.R0;
  data.super_OpLayoutAuxNoReg.Offset = RVar1;
  Data::Encode(&this->m_byteCodeData,op,&local_38,0xc,this);
  return;
}

Assistant:

void ByteCodeWriter::AuxiliaryContext(OpCode op, RegSlot destinationRegister, const void* buffer, int byteCount, Js::RegSlot C1)
    {
        CheckOpen();
        destinationRegister = ConsumeReg(destinationRegister);
        C1 = ConsumeReg(C1);

        //
        // Write the buffer's contents
        //

        int currentOffset = m_auxContextData.GetCurrentOffset();
        if (byteCount > 0)
        {
            m_auxContextData.Encode(buffer, byteCount);
        }

        //
        // Write OpCode to create new auxiliary data
        //

        OpLayoutAuxiliary data;
        data.R0 = destinationRegister;
        data.Offset = currentOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }